

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  unsigned_short *puVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImFontGlyph *pIVar12;
  ImFontGlyph *pIVar13;
  uint uVar14;
  char *__function;
  long lVar15;
  float *pfVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  float fVar22;
  
  uVar21 = (this->Glyphs).Size;
  if ((ulong)uVar21 == 0) {
    uVar18 = 1;
  }
  else {
    lVar15 = 0;
    uVar14 = 0;
    if (0 < (int)uVar21) {
      uVar14 = uVar21;
    }
    uVar18 = 0;
    do {
      if (uVar14 <= uVar21 - 1) {
        __function = "T &ImVector<ImFontGlyph>::operator[](int) [T = ImFontGlyph]";
        goto LAB_0013971c;
      }
      uVar20 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar15) >> 2;
      if (uVar18 <= uVar20) {
        uVar18 = uVar20;
      }
      lVar15 = lVar15 + 0x28;
    } while ((ulong)uVar21 * 0x28 != lVar15);
    uVar18 = uVar18 + 1;
  }
  if (0xfffe < (int)uVar21) {
    __assert_fail("Glyphs.Size < 0xFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0xc46,"void ImFont::BuildLookupTable()");
  }
  pfVar4 = (this->IndexAdvanceX).Data;
  if (pfVar4 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar4);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  puVar5 = (this->IndexLookup).Data;
  if (puVar5 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar5);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar18);
  iVar2 = (this->Glyphs).Size;
  lVar15 = (long)iVar2;
  if (0 < lVar15) {
    pfVar4 = (this->IndexAdvanceX).Data;
    puVar5 = (this->IndexLookup).Data;
    pfVar16 = &((this->Glyphs).Data)->AdvanceX;
    lVar19 = 0;
    do {
      uVar21 = *(uint *)(pfVar16 + -1);
      uVar14 = uVar21 >> 2;
      if ((this->IndexAdvanceX).Size <= (int)uVar14) goto LAB_001396d9;
      pfVar4[uVar14] = *pfVar16;
      if ((this->IndexLookup).Size <= (int)uVar14) goto LAB_001396f0;
      puVar5[uVar14] = (unsigned_short)lVar19;
      this->Used4kPagesMap[uVar21 >> 0x11] =
           this->Used4kPagesMap[uVar21 >> 0x11] | (byte)(1 << ((byte)(uVar21 >> 0xe) & 7));
      lVar19 = lVar19 + 1;
      pfVar16 = pfVar16 + 10;
    } while (lVar15 != lVar19);
  }
  if (((uint)(this->IndexLookup).Size < 0x21) ||
     (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
    pIVar13 = this->FallbackGlyph;
  }
  else {
    pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
  }
  if (pIVar13 == (ImFontGlyph *)0x0) {
LAB_00139600:
    if (((uint)(this->IndexLookup).Size < 0x21) ||
       (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
      pIVar13 = this->FallbackGlyph;
    }
    else {
      pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
    if (pIVar13 != (ImFontGlyph *)0x0) {
      *(byte *)pIVar13 = *(byte *)pIVar13 & 0xfd;
    }
    if (((uint)(this->IndexLookup).Size < 10) ||
       (uVar1 = (this->IndexLookup).Data[9], uVar1 == 0xffff)) {
      pIVar13 = this->FallbackGlyph;
    }
    else {
      pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
    if (pIVar13 != (ImFontGlyph *)0x0) {
      *(byte *)pIVar13 = *(byte *)pIVar13 & 0xfd;
    }
    if ((ulong)this->FallbackChar < (ulong)(long)(this->IndexLookup).Size) {
      uVar1 = (this->IndexLookup).Data[this->FallbackChar];
      pIVar13 = (ImFontGlyph *)0x0;
      if (uVar1 != 0xffff) {
        pIVar13 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
      }
    }
    else {
      pIVar13 = (ImFontGlyph *)0x0;
    }
    this->FallbackGlyph = pIVar13;
    fVar22 = 0.0;
    if (pIVar13 != (ImFontGlyph *)0x0) {
      fVar22 = pIVar13->AdvanceX;
    }
    this->FallbackAdvanceX = fVar22;
    pfVar4 = (this->IndexAdvanceX).Data;
    uVar17 = 0;
    while ((long)uVar17 < (long)(this->IndexAdvanceX).Size) {
      pfVar16 = pfVar4 + uVar17;
      if (*pfVar16 <= 0.0 && *pfVar16 != 0.0) {
        pfVar4[uVar17] = this->FallbackAdvanceX;
      }
      uVar17 = uVar17 + 1;
      if (uVar18 == uVar17) {
        return;
      }
    }
  }
  else {
    if (iVar2 < 1) {
LAB_00139726:
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                    ,0x695,"T &ImVector<ImFontGlyph>::back() [T = ImFontGlyph]");
    }
    if (((undefined1  [40])(this->Glyphs).Data[lVar15 + -1] & (undefined1  [40])0xfffffffc) !=
        (undefined1  [40])0x24) {
      uVar21 = iVar2 + 1;
      iVar3 = (this->Glyphs).Capacity;
      if (iVar3 <= iVar2) {
        if (iVar3 == 0) {
          uVar14 = 8;
        }
        else {
          uVar14 = iVar3 / 2 + iVar3;
        }
        if ((int)uVar14 <= (int)uVar21) {
          uVar14 = uVar21;
        }
        if (iVar3 < (int)uVar14) {
          pIVar12 = (ImFontGlyph *)ImGui::MemAlloc((ulong)uVar14 * 0x28);
          pIVar13 = (this->Glyphs).Data;
          if (pIVar13 != (ImFontGlyph *)0x0) {
            memcpy(pIVar12,pIVar13,(long)(this->Glyphs).Size * 0x28);
            ImGui::MemFree((this->Glyphs).Data);
          }
          (this->Glyphs).Data = pIVar12;
          (this->Glyphs).Capacity = uVar14;
        }
      }
      (this->Glyphs).Size = uVar21;
    }
    lVar15 = (long)(this->Glyphs).Size;
    if (lVar15 < 1) goto LAB_00139726;
    pIVar13 = (this->Glyphs).Data;
    if (((uint)(this->IndexLookup).Size < 0x21) ||
       (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
      pIVar12 = this->FallbackGlyph;
    }
    else {
      pIVar12 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar1 * 0x28);
    }
    fVar22 = pIVar12->V1;
    pIVar13[lVar15 + -1].U1 = pIVar12->U1;
    pIVar13[lVar15 + -1].V1 = fVar22;
    uVar8 = *(undefined4 *)&pIVar12->field_0x0;
    fVar9 = pIVar12->AdvanceX;
    fVar10 = pIVar12->X0;
    fVar11 = pIVar12->Y0;
    fVar22 = pIVar12->Y1;
    fVar6 = pIVar12->U0;
    fVar7 = pIVar12->V0;
    pIVar13[lVar15 + -1].X1 = pIVar12->X1;
    pIVar13[lVar15 + -1].Y1 = fVar22;
    pIVar13[lVar15 + -1].U0 = fVar6;
    pIVar13[lVar15 + -1].V0 = fVar7;
    *(undefined4 *)&pIVar13[lVar15 + -1].field_0x0 = uVar8;
    pIVar13[lVar15 + -1].AdvanceX = fVar9;
    pIVar13[lVar15 + -1].X0 = fVar10;
    pIVar13[lVar15 + -1].Y0 = fVar11;
    *(uint *)(pIVar13 + lVar15 + -1) = *(uint *)(pIVar13 + lVar15 + -1) & 3 | 0x24;
    fVar22 = pIVar13[lVar15 + -1].AdvanceX * 4.0;
    pIVar13[lVar15 + -1].AdvanceX = fVar22;
    if (9 < (this->IndexAdvanceX).Size) {
      (this->IndexAdvanceX).Data[9] = fVar22;
      if ((this->IndexLookup).Size <= (int)(*(uint *)(pIVar13 + lVar15 + -1) >> 2)) {
LAB_001396f0:
        __function = "T &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
        goto LAB_0013971c;
      }
      (this->IndexLookup).Data[*(uint *)(pIVar13 + lVar15 + -1) >> 2] =
           (short)(this->Glyphs).Size - 1;
      goto LAB_00139600;
    }
  }
LAB_001396d9:
  __function = "T &ImVector<float>::operator[](int) [T = float]";
LAB_0013971c:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x68b,__function);
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Setup fall-backs
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}